

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmatrix.cpp
# Opt level: O0

MatrixType __thiscall VMatrix::type(VMatrix *this)

{
  bool bVar1;
  long in_RDI;
  float dot;
  
  if ((*(char *)(in_RDI + 0x25) == '\0') || (*(byte *)(in_RDI + 0x25) < *(byte *)(in_RDI + 0x24))) {
    return *(MatrixType *)(in_RDI + 0x24);
  }
  switch(*(undefined1 *)(in_RDI + 0x25)) {
  case 0:
    goto switchD_0012cb30_caseD_0;
  case 1:
    goto switchD_0012cb30_caseD_1;
  case 2:
    goto switchD_0012cb30_caseD_2;
  default:
    goto switchD_0012cb30_caseD_3;
  case 4:
  case 8:
    break;
  case 0x10:
    bVar1 = vIsZero(0.0);
    if (((!bVar1) || (bVar1 = vIsZero(0.0), !bVar1)) || (bVar1 = vIsZero(0.0), !bVar1)) {
      *(undefined1 *)(in_RDI + 0x24) = 0x10;
      goto switchD_0012cb30_caseD_3;
    }
  }
  bVar1 = vIsZero(0.0);
  if ((bVar1) && (bVar1 = vIsZero(0.0), bVar1)) {
switchD_0012cb30_caseD_2:
    bVar1 = vIsZero(0.0);
    if ((bVar1) && (bVar1 = vIsZero(0.0), bVar1)) {
switchD_0012cb30_caseD_1:
      bVar1 = vIsZero(0.0);
      if ((bVar1) && (bVar1 = vIsZero(0.0), bVar1)) {
switchD_0012cb30_caseD_0:
        *(undefined1 *)(in_RDI + 0x24) = 0;
      }
      else {
        *(undefined1 *)(in_RDI + 0x24) = 1;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0x24) = 2;
    }
  }
  else {
    bVar1 = vIsZero(0.0);
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0x24) = 4;
    }
    else {
      *(undefined1 *)(in_RDI + 0x24) = 8;
    }
  }
switchD_0012cb30_caseD_3:
  *(undefined1 *)(in_RDI + 0x25) = 0;
  return *(MatrixType *)(in_RDI + 0x24);
}

Assistant:

VMatrix::MatrixType VMatrix::type() const
{
    if (dirty == MatrixType::None || dirty < mType) return mType;

    switch (dirty) {
    case MatrixType::Project:
        if (!vIsZero(m13) || !vIsZero(m23) || !vIsZero(m33 - 1)) {
            mType = MatrixType::Project;
            break;
        }
        VECTOR_FALLTHROUGH
    case MatrixType::Shear:
    case MatrixType::Rotate:
        if (!vIsZero(m12) || !vIsZero(m21)) {
            const float dot = m11 * m12 + m21 * m22;
            if (vIsZero(dot))
                mType = MatrixType::Rotate;
            else
                mType = MatrixType::Shear;
            break;
        }
        VECTOR_FALLTHROUGH
    case MatrixType::Scale:
        if (!vIsZero(m11 - 1) || !vIsZero(m22 - 1)) {
            mType = MatrixType::Scale;
            break;
        }
        VECTOR_FALLTHROUGH
    case MatrixType::Translate:
        if (!vIsZero(mtx) || !vIsZero(mty)) {
            mType = MatrixType::Translate;
            break;
        }